

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void sendfile_cb(uv_fs_t *req)

{
  if (req == &sendfile_req) {
    if (sendfile_req.fs_type == UV_FS_SENDFILE) {
      if (sendfile_req.result == 0x10009) {
        sendfile_cb_count = sendfile_cb_count + 1;
        uv_fs_req_cleanup(&sendfile_req);
        return;
      }
      goto LAB_0015cd09;
    }
  }
  else {
    sendfile_cb_cold_1();
  }
  sendfile_cb_cold_2();
LAB_0015cd09:
  sendfile_cb_cold_3();
  test_sendfile((_func_void_int *)0x0,sendfile_nodata_cb,0);
  return;
}

Assistant:

static void sendfile_cb(uv_fs_t* req) {
  ASSERT(req == &sendfile_req);
  ASSERT(req->fs_type == UV_FS_SENDFILE);
  ASSERT(req->result == 65545);
  sendfile_cb_count++;
  uv_fs_req_cleanup(req);
}